

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O1

omittable_field<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_> *
__thiscall
discordpp::
omittable_field<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>::
operator=(omittable_field<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>
          *this)

{
  _Head_base<0UL,_std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_*,_false>
  __ptr;
  
  __ptr._M_head_impl =
       (this->
       super_field<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>).
       t_._M_t.
       super___uniq_ptr_impl<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>,_std::default_delete<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_*,_std::default_delete<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>_>
       .
       super__Head_base<0UL,_std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_*,_false>
       ._M_head_impl;
  (this->super_field<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>)
  .t_._M_t.
  super___uniq_ptr_impl<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>,_std::default_delete<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_*,_std::default_delete<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>_>
  .
  super__Head_base<0UL,_std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_*,_false>
  ._M_head_impl = (vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_> *)0x0;
  if (__ptr._M_head_impl !=
      (vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_> *)0x0) {
    std::
    default_delete<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>::
    operator()((default_delete<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>
                *)&this->
                   super_field<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>
               ,__ptr._M_head_impl);
  }
  (this->super_field<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>)
  .s_ = omitted_e;
  return this;
}

Assistant:

virtual omittable_field &operator=(omitted_t) {
        field<T>::t_ = nullptr;
        field<T>::s_ = field<T>::omitted_e;
        return *this;
    }